

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<int> * kj::newPromiseAndFulfiller<int>(void)

{
  RefOrVoid<kj::_::WeakFulfiller<int>_> params;
  Own<kj::_::PromiseNode> *pOVar1;
  int *piVar2;
  Promise<int> *pPVar3;
  Own<kj::_::WeakFulfiller<int>_> *other;
  PromiseFulfillerPair<int> *in_RDI;
  void *local_68;
  undefined1 local_60 [8];
  ReducePromises<int> promise;
  Own<kj::_::AdapterPromiseNode<int,_kj::_::PromiseAndFulfillerAdapter<int>_>_> local_40;
  undefined1 local_30 [8];
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::WeakFulfiller<int>_> wrapper;
  
  _::WeakFulfiller<int>::make();
  params = Own<kj::_::WeakFulfiller<int>_>::operator*
                     ((Own<kj::_::WeakFulfiller<int>_> *)&intermediate.ptr);
  heap<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,kj::_::WeakFulfiller<int>&>
            ((kj *)&local_40,params);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,void>
            ((Own<kj::_::PromiseNode> *)local_30,&local_40);
  Own<kj::_::AdapterPromiseNode<int,_kj::_::PromiseAndFulfillerAdapter<int>_>_>::~Own(&local_40);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)local_30);
  local_68 = (void *)0x0;
  piVar2 = implicitCast<int*,decltype(nullptr)>(&local_68);
  pOVar1 = _::maybeChain<int>(pOVar1,piVar2);
  Promise<int>::Promise((Promise<int> *)local_60,false,pOVar1);
  pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_60);
  Promise<int>::Promise(&in_RDI->promise,pPVar3);
  other = mv<kj::Own<kj::_::WeakFulfiller<int>>>
                    ((Own<kj::_::WeakFulfiller<int>_> *)&intermediate.ptr);
  Own<kj::PromiseFulfiller<int>>::Own<kj::_::WeakFulfiller<int>,void>
            ((Own<kj::PromiseFulfiller<int>> *)&in_RDI->fulfiller,other);
  Promise<int>::~Promise((Promise<int> *)local_60);
  Own<kj::_::PromiseNode>::~Own((Own<kj::_::PromiseNode> *)local_30);
  Own<kj::_::WeakFulfiller<int>_>::~Own((Own<kj::_::WeakFulfiller<int>_> *)&intermediate.ptr);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}